

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O0

parser * init_parse_ui_entry_renderer(void)

{
  parser *p_00;
  parser *p;
  
  p_00 = parser_new();
  parser_setpriv(p_00,(void *)0x0);
  parser_reg(p_00,"name str name",parse_renderer_name);
  parser_reg(p_00,"code str code",parse_renderer_code);
  parser_reg(p_00,"combine str combine",parse_renderer_combine);
  parser_reg(p_00,"colors str colors",parse_renderer_colors);
  parser_reg(p_00,"labelcolors str colors",parse_renderer_labelcolors);
  parser_reg(p_00,"symbols str symbols",parse_renderer_symbols);
  parser_reg(p_00,"ndigit int ndigit",parse_renderer_ndigit);
  parser_reg(p_00,"sign str sign",parse_renderer_sign);
  parser_reg(p_00,"units str units",parse_renderer_units);
  parser_reg(p_00,"combined-renderer str name",parse_renderer_combined_renderer);
  return p_00;
}

Assistant:

static struct parser *init_parse_ui_entry_renderer(void)
{
	struct parser *p = parser_new();

	parser_setpriv(p, NULL);
	parser_reg(p, "name str name", parse_renderer_name);
	parser_reg(p, "code str code", parse_renderer_code);
	parser_reg(p, "combine str combine", parse_renderer_combine);
	parser_reg(p, "colors str colors", parse_renderer_colors);
	parser_reg(p, "labelcolors str colors", parse_renderer_labelcolors);
	parser_reg(p, "symbols str symbols", parse_renderer_symbols);
	parser_reg(p, "ndigit int ndigit", parse_renderer_ndigit);
	parser_reg(p, "sign str sign", parse_renderer_sign);
	parser_reg(p, "units str units", parse_renderer_units);
	parser_reg(p, "combined-renderer str name",
		parse_renderer_combined_renderer);
	return p;
}